

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::GetPropertyName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *this_00;
  char *in_RCX;
  long lVar4;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  undefined **ppuVar5;
  char **ppcVar6;
  byte bVar7;
  string_view input;
  allocator_type local_82;
  key_equal local_81;
  iterator local_80;
  undefined1 local_70 [88];
  
  bVar7 = 0;
  if ((GetPropertyName[abi:cxx11](google::protobuf::FieldDescriptor_const*)::reserved_member_names
       == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetPropertyName[abi:cxx11](google::protobuf::FieldDescriptor_const*)
                                   ::reserved_member_names), descriptor = extraout_RDX, iVar2 != 0))
  {
    this_00 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
               *)operator_new(0x20);
    ppuVar5 = &PTR_anon_var_dwarf_b21488_0084aef8;
    ppcVar6 = (char **)local_70;
    for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
      *ppcVar6 = *ppuVar5;
      ppuVar5 = ppuVar5 + (ulong)bVar7 * -2 + 1;
      ppcVar6 = ppcVar6 + (ulong)bVar7 * -2 + 1;
    }
    in_RCX = (char *)0x0;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::raw_hash_set<char_const*const*>
              (this_00,(char **)local_70,(char **)&stack0xffffffffffffffe8,0,(hasher *)&local_80,
               &local_81,&local_82);
    GetPropertyName::reserved_member_names =
         (flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *)this_00;
    __cxa_guard_release(&GetPropertyName[abi:cxx11](google::protobuf::FieldDescriptor_const*)::
                         reserved_member_names);
    descriptor = extraout_RDX_00;
  }
  GetFieldName_abi_cxx11_((string *)local_70,this,descriptor);
  input._M_str = in_RCX;
  input._M_len = local_70._0_8_;
  UnderscoresToPascalCase_abi_cxx11_(__return_storage_ptr__,(csharp *)local_70._8_8_,input);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  __n = __return_storage_ptr__->_M_string_length;
  uVar3 = (ulong)**(ushort **)(*(long *)(this + 0x20) + 0x10);
  if ((__n != uVar3) ||
     ((__n != 0 &&
      (iVar2 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,
                    (void *)((long)*(ushort **)(*(long *)(this + 0x20) + 0x10) + ~uVar3),__n),
      iVar2 != 0)))) {
    local_70._0_16_ =
         (undefined1  [16])
         absl::lts_20250127::container_internal::
         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
         ::find<std::__cxx11::string>
                   ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                     *)GetPropertyName::reserved_member_names,__return_storage_ptr__);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::AssertNotDebugCapacity
              (&GetPropertyName::reserved_member_names->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              );
    local_80.ctrl_ = (ctrl_t *)0x0;
    bVar1 = absl::lts_20250127::container_internal::operator==((iterator *)local_70,&local_80);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  local_70._8_8_ = (slot_type *)0x6088d8;
  local_70._0_8_ = (ctrl_t *)0x1;
  absl::lts_20250127::StrAppend(__return_storage_ptr__,(AlphaNum *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string GetPropertyName(const FieldDescriptor* descriptor) {
  // Names of members declared or overridden in the message.
  static const auto& reserved_member_names =
      *new absl::flat_hash_set<absl::string_view>(
          {"Types", "Descriptor", "Equals", "ToString", "GetHashCode",
           "WriteTo", "Clone", "CalculateSize", "MergeFrom", "OnConstruction",
           "Parser"});

  // TODO: consider introducing csharp_property_name field option
  std::string property_name = UnderscoresToPascalCase(GetFieldName(descriptor));
  // Avoid either our own type name or reserved names.
  // There are various ways of ending up with naming collisions, but we try to
  // avoid obvious ones. In particular, we avoid the names of all the members we
  // generate. Note that we *don't* add an underscore for MemberwiseClone or
  // GetType. Those generate warnings, but not errors; changing the name now
  // could be a breaking change.
  if (property_name == descriptor->containing_type()->name() ||
      reserved_member_names.find(property_name) !=
          reserved_member_names.end()) {
    absl::StrAppend(&property_name, "_");
  }
  return property_name;
}